

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::GridSample_x86_avx::forward
          (GridSample_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Mat *src;
  Mat *this_00;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  float *pfVar21;
  int iVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  float *pfVar26;
  int *offset_ptr;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  Mat local_f8;
  Option *local_b0;
  size_t local_a8;
  int local_9c;
  Mat local_98;
  undefined1 auStack_4a [2];
  float local_48 [6];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_9c = src->elempack;
  uVar2 = src->c;
  iVar3 = src->dims;
  local_a8 = src->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (float *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8._20_8_ = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  local_b0 = opt;
  if (src[1].elempack == 1) {
    if (&local_98 != src + 1) {
      piVar6 = src[1].refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_f8.cstep = 0;
      local_f8.c = 0;
      local_f8.d = 0;
      local_f8.h = 0;
      local_f8.w = 0;
      local_f8.dims = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8._20_8_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.refcount._0_4_ = 0;
      local_f8.data = (float *)0x0;
      local_98.data = src[1].data;
      local_98.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_98.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_98.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_98.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_98.elempack = src[1].elempack;
      local_98.allocator = src[1].allocator;
      uVar14 = src[1].dims;
      uVar15 = src[1].w;
      uVar16 = src[1].h;
      uVar17 = src[1].d;
      local_98.c = src[1].c;
      local_98.cstep = src[1].cstep;
      local_98.dims = uVar14;
      local_98.w = uVar15;
      local_98.h = uVar16;
      local_98.d = uVar17;
    }
  }
  else {
    convert_packing(src + 1,&local_98,1,opt);
  }
  if (iVar3 == 3) {
    uVar5 = local_98.h;
    uVar18 = local_98.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      uVar5 = local_98.c;
      uVar18 = local_98.h;
    }
    opt = (Option *)(ulong)uVar2;
    Mat::create(this_00,uVar18,uVar5,uVar2,local_a8,local_9c,local_b0->blob_allocator);
    iVar22 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_005e4c60;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_f8,uVar18,uVar5,local_a8 * 6,6,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005e4c60;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else if (iVar19 == 2) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_005e4c60;
        }
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_f8,uVar18,uVar5,1,local_a8,1,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005e4c60;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else if (iVar19 == 2) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_005e4c60;
        }
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_f8,uVar18,uVar5,local_a8 * 0x12,0x12,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005e4c60;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar5 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar5;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar5);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar5);
        }
      }
      else if (iVar19 == 2) {
        uVar5 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar5;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar5);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar5);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_005e4c60;
        }
        uVar5 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar5;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar5);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar5);
        }
      }
    }
  }
  if (iVar3 == 4) {
    uVar5 = local_98.d;
    uVar18 = local_98.w;
    uVar4 = local_98.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      uVar5 = local_98.c;
      uVar18 = local_98.h;
      uVar4 = local_98.d;
    }
    opt = (Option *)(ulong)uVar5;
    Mat::create(this_00,uVar18,uVar4,uVar5,uVar2,local_a8,local_9c,local_b0->blob_allocator);
    iVar22 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_005e4c60;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_f8,uVar18,uVar4,uVar5,local_a8 * 0xb,0xb,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005e4c60;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
      else if (iVar19 == 2) {
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_005e4c60;
        }
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_f8,uVar18,uVar4,uVar5,1,local_a8,1,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005e4c60;
      iVar19 = (this->super_GridSample).padding_mode;
      if (iVar19 == 3) {
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
      else if (iVar19 == 2) {
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
      else {
        if (iVar19 != 1) {
          forward();
          goto LAB_005e4c60;
        }
        uVar2 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar2;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar2);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar2);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_005e4c60;
    }
  }
  iVar19 = 0;
  iVar22 = 0;
  if (local_9c != 1) {
    if (local_9c != 4) {
      iVar22 = iVar19;
      if (local_9c != 8) goto LAB_005e4c60;
      if (iVar3 == 3) {
        iVar3 = (this->super_GridSample).sample_type;
        if (iVar3 == 3) {
          gridsample_2d_bicubic_apply_interpolation_p8(src,this_00,&local_f8,opt);
          goto LAB_005e4c60;
        }
        if (iVar3 != 2) {
          if (iVar3 == 1) {
            gridsample_2d_bilinear_apply_interpolation_p8(src,this_00,&local_f8,opt);
          }
          goto LAB_005e4c60;
        }
      }
      else {
        if (iVar3 != 4) goto LAB_005e4c60;
        iVar3 = (this->super_GridSample).sample_type;
        if (iVar3 != 2) {
          if (iVar3 == 1) {
            gridsample_3d_bilinear_apply_interpolation_p8(src,this_00,&local_f8,opt);
          }
          goto LAB_005e4c60;
        }
      }
      gridsample_nearest_apply_interpolation_p8(src,this_00,&local_f8,opt);
      goto LAB_005e4c60;
    }
    if (iVar3 == 3) {
      iVar3 = (this->super_GridSample).sample_type;
      if (iVar3 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4(src,this_00,&local_f8,opt);
        goto LAB_005e4c60;
      }
      if (iVar3 != 2) {
        if (iVar3 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p4(src,this_00,&local_f8,opt);
        }
        goto LAB_005e4c60;
      }
    }
    else {
      if (iVar3 != 4) goto LAB_005e4c60;
      iVar3 = (this->super_GridSample).sample_type;
      if (iVar3 != 2) {
        if (iVar3 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p4(src,this_00,&local_f8,opt);
        }
        goto LAB_005e4c60;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,&local_f8,opt);
    goto LAB_005e4c60;
  }
  if (iVar3 == 3) {
    iVar3 = (this->super_GridSample).sample_type;
    if (iVar3 == 3) {
      iVar3 = this_00->c;
      if (0 < (long)iVar3) {
        iVar19 = this_00->h * this_00->w;
        pvVar7 = src->data;
        sVar8 = src->elemsize;
        sVar9 = src->cstep;
        pvVar23 = this_00->data;
        sVar10 = this_00->elemsize;
        sVar11 = this_00->cstep;
        lVar24 = 0;
        do {
          if (0 < iVar19) {
            lVar20 = sVar8 * sVar9 * lVar24;
            pfVar21 = (float *)(sVar10 * sVar11 * lVar24 + (long)pvVar23);
            iVar22 = 0;
            pfVar26 = (float *)local_f8.data;
            do {
              fVar30 = *pfVar26;
              fVar27 = pfVar26[1];
              fVar33 = fVar30 + 1.0;
              fVar33 = fVar33 * fVar33 * (3.75 - fVar33 * 0.75) + fVar33 * -6.0 + 3.0;
              auVar34 = vinsertps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)(1.0 - fVar30)),0x10);
              fVar30 = auVar34._0_4_;
              fVar31 = auVar34._4_4_;
              fVar1 = auVar34._8_4_;
              fVar13 = auVar34._12_4_;
              auVar28._0_4_ = fVar30 * fVar30 * (fVar30 * 1.25 + -2.25);
              auVar28._4_4_ = fVar31 * fVar31 * (fVar31 * 1.25 + -2.25);
              auVar28._8_4_ = fVar1 * fVar1 * (fVar1 * 1.25 + -2.25);
              auVar28._12_4_ = fVar13 * fVar13 * (fVar13 * 1.25 + -2.25);
              auVar12 = vmovshdup_avx(auVar28);
              fVar30 = fVar27 + 1.0;
              auVar34 = vinsertps_avx(ZEXT416((uint)fVar27),ZEXT416((uint)(1.0 - fVar27)),0x10);
              fVar27 = auVar34._0_4_;
              fVar31 = auVar34._4_4_;
              fVar1 = auVar34._8_4_;
              fVar13 = auVar34._12_4_;
              auVar34._0_4_ = fVar27 * fVar27 * (fVar27 * 1.25 + -2.25);
              auVar34._4_4_ = fVar31 * fVar31 * (fVar31 * 1.25 + -2.25);
              auVar34._8_4_ = fVar1 * fVar1 * (fVar1 * 1.25 + -2.25);
              auVar34._12_4_ = fVar13 * fVar13 * (fVar13 * 1.25 + -2.25);
              lVar25 = 2;
              do {
                auVar32 = ZEXT416(0) << 0x20;
                fVar27 = 0.0;
                if (-1 < (long)(int)pfVar26[lVar25]) {
                  fVar27 = *(float *)((long)pvVar7 + (long)(int)pfVar26[lVar25] * 4 + lVar20);
                }
                if (-1 < (long)(int)pfVar26[lVar25 + 1]) {
                  auVar32 = ZEXT416(*(uint *)((long)pvVar7 +
                                             (long)(int)pfVar26[lVar25 + 1] * 4 + lVar20));
                }
                fVar31 = 0.0;
                auVar29 = ZEXT816(0) << 0x40;
                if (-1 < (long)(int)pfVar26[lVar25 + 2]) {
                  auVar29 = ZEXT416(*(uint *)((long)pvVar7 +
                                             (long)(int)pfVar26[lVar25 + 2] * 4 + lVar20));
                }
                if (-1 < (long)(int)pfVar26[lVar25 + 3]) {
                  fVar31 = *(float *)((long)pvVar7 + (long)(int)pfVar26[lVar25 + 3] * 4 + lVar20);
                }
                auVar32 = vinsertps_avx(auVar32,auVar29,0x10);
                auVar29._0_4_ = (auVar28._0_4_ + 1.0) * auVar32._0_4_;
                auVar29._4_4_ = (auVar28._4_4_ + 1.0) * auVar32._4_4_;
                auVar29._8_4_ = (auVar28._8_4_ + 1.0) * auVar32._8_4_;
                auVar29._12_4_ = (auVar28._12_4_ + 1.0) * auVar32._12_4_;
                auVar32 = vmovshdup_avx(auVar29);
                *(float *)(auStack_4a + lVar25) =
                     (fVar27 * fVar33 + auVar29._0_4_ + auVar32._0_4_) -
                     (fVar33 + auVar28._0_4_ + 1.0 + auVar12._0_4_) * fVar31;
                lVar25 = lVar25 + 4;
              } while (lVar25 != 0x12);
              auVar12 = vmovshdup_avx(auVar34);
              fVar30 = fVar30 * fVar30 * (3.75 - fVar30 * 0.75) + fVar30 * -6.0 + 3.0;
              auVar32._0_4_ = (float)local_48._4_8_ * (auVar34._0_4_ + 1.0);
              auVar32._4_4_ = SUB84(local_48._4_8_,4) * (auVar34._4_4_ + 1.0);
              auVar32._8_4_ = (auVar34._8_4_ + 1.0) * 0.0;
              auVar32._12_4_ = (auVar34._12_4_ + 1.0) * 0.0;
              auVar28 = vmovshdup_avx(auVar32);
              *pfVar21 = (auVar28._0_4_ + auVar32._0_4_ + fVar30 * local_48[0]) -
                         (auVar12._0_4_ + auVar34._0_4_ + 1.0 + fVar30) * local_48[3];
              pfVar21 = pfVar21 + 1;
              pfVar26 = pfVar26 + 0x12;
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar19);
          }
          lVar24 = lVar24 + 1;
          iVar22 = 0;
        } while (lVar24 != iVar3);
      }
      goto LAB_005e4c60;
    }
    if (iVar3 != 2) {
      if ((iVar3 == 1) && (iVar3 = this_00->c, 0 < (long)iVar3)) {
        iVar19 = this_00->h * this_00->w;
        pvVar7 = src->data;
        sVar8 = src->elemsize;
        sVar9 = src->cstep;
        pvVar23 = this_00->data;
        sVar10 = this_00->elemsize;
        sVar11 = this_00->cstep;
        lVar24 = 0;
        iVar22 = 0;
        do {
          if (0 < iVar19) {
            lVar20 = sVar8 * sVar9 * lVar24;
            lVar25 = 0;
            pfVar26 = (float *)local_f8.data;
            do {
              fVar27 = 0.0;
              fVar30 = 0.0;
              if (-1 < (long)(int)*pfVar26) {
                fVar30 = *(float *)((long)pvVar7 + (long)(int)*pfVar26 * 4 + lVar20);
              }
              if (-1 < (long)(int)pfVar26[1]) {
                fVar27 = *(float *)((long)pvVar7 + (long)(int)pfVar26[1] * 4 + lVar20);
              }
              fVar31 = 0.0;
              fVar33 = 0.0;
              if (-1 < (long)(int)pfVar26[2]) {
                fVar33 = *(float *)((long)pvVar7 + (long)(int)pfVar26[2] * 4 + lVar20);
              }
              if (-1 < (long)(int)pfVar26[3]) {
                fVar31 = *(float *)((long)pvVar7 + (long)(int)pfVar26[3] * 4 + lVar20);
              }
              fVar1 = pfVar26[4];
              fVar30 = (1.0 - fVar1) * fVar30 + fVar1 * fVar27;
              *(float *)((long)pvVar23 + lVar25 * 4) =
                   (((1.0 - fVar1) * fVar33 + fVar1 * fVar31) - fVar30) * pfVar26[5] + fVar30;
              pfVar26 = pfVar26 + 6;
              lVar25 = lVar25 + 1;
            } while (iVar19 != (int)lVar25);
          }
          lVar24 = lVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar10 * sVar11);
        } while (lVar24 != iVar3);
      }
      goto LAB_005e4c60;
    }
  }
  else {
    if (iVar3 != 4) goto LAB_005e4c60;
    iVar3 = (this->super_GridSample).sample_type;
    if (iVar3 != 2) {
      if (iVar3 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1(src,this_00,&local_f8,opt);
      }
      goto LAB_005e4c60;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,this_00,&local_f8,opt);
LAB_005e4c60:
  piVar6 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  piVar6 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((float *)local_f8.data != (float *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int GridSample_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}